

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O3

void __thiscall
SubcommandProgram_CallbackOrder_Test::TestBody(SubcommandProgram_CallbackOrder_Test *this)

{
  input_t *piVar1;
  pointer *ppiVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> callback_order;
  allocator_type local_e1;
  AssertHelper local_e0;
  internal local_d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  vector<int,_std::allocator<int>_> local_88;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48._8_8_ = 0;
  local_30 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:635:25)>
             ::_M_invoke;
  local_38 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:635:25)>
             ::_M_manager;
  local_48._M_unused._M_object = &local_88;
  CLI::std::function<void_()>::operator=
            (&((this->super_SubcommandProgram).start)->callback_,(function<void_()> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  local_68._8_8_ = 0;
  local_50 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:636:24)>
             ::_M_invoke;
  local_58 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:636:24)>
             ::_M_manager;
  local_68._M_unused._M_object = &local_88;
  CLI::std::function<void_()>::operator=
            (&((this->super_SubcommandProgram).stop)->callback_,(function<void_()> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  ppiVar2 = &local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)ppiVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"start","");
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"stop","");
  piVar1 = &(this->super_SubcommandProgram).super_TApp.args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_c8,
             &local_88);
  lVar5 = 0;
  do {
    if (local_98 + lVar5 != *(undefined1 **)((long)local_a8 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_a8 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  TApp::run((TApp *)this);
  local_e0.data_ = (AssertHelperData *)0x200000001;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_e0;
  CLI::std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l,&local_e1);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            (local_d8,"callback_order","std::vector<int>({1, 2})",&local_88,&local_c8);
  if ((pointer *)
      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer *)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x280,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((pointer *)
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((pointer *)
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0)) {
        (**(code **)(*(pointer *)
                      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 2))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::App::reset(&(this->super_SubcommandProgram).super_TApp.app);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  }
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)ppiVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"stop","");
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"start","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_c8,
             &local_88);
  lVar5 = 0;
  do {
    if (local_98 + lVar5 != *(undefined1 **)((long)local_a8 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_a8 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  TApp::run((TApp *)this);
  local_e0.data_ = (AssertHelperData *)0x100000002;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_e0;
  CLI::std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l_00,&local_e1);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            (local_d8,"callback_order","std::vector<int>({2, 1})",&local_88,&local_c8);
  if ((pointer *)
      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer *)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x287,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((pointer *)
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((pointer *)
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0)) {
        (**(code **)(*(pointer *)
                      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 2))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(SubcommandProgram, CallbackOrder) {
    std::vector<int> callback_order;
    start->set_callback([&callback_order]() { callback_order.push_back(1); });
    stop->set_callback([&callback_order]() { callback_order.push_back(2); });

    args = {"start", "stop"};
    run();
    EXPECT_EQ(callback_order, std::vector<int>({1, 2}));

    app.reset();
    callback_order.clear();

    args = {"stop", "start"};
    run();
    EXPECT_EQ(callback_order, std::vector<int>({2, 1}));
}